

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcSlab::~IfcSlab(IfcSlab *this,void **vtt)

{
  void **vtt_local;
  IfcSlab *this_local;
  
  *(void **)this = *vtt;
  *(void **)(&this->field_0x0 + *(long *)(*(long *)this + -0x18)) = vtt[0x2a];
  *(void **)&this->field_0x88 = vtt[0x2b];
  *(void **)&this->field_0x98 = vtt[0x2c];
  *(void **)&this->field_0xd0 = vtt[0x2d];
  *(void **)&this->field_0x100 = vtt[0x2e];
  *(void **)&this->field_0x138 = vtt[0x2f];
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSlab,_1UL>)._vptr_ObjectHelper =
       (_func_int **)vtt[0x30];
  STEP::Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~Maybe((Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
         &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSlab,_1UL>).field_0x10);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcSlab,_1UL>::~ObjectHelper
            (&this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSlab,_1UL>,vtt + 0x28);
  IfcBuildingElement::~IfcBuildingElement((IfcBuildingElement *)this,vtt + 1);
  return;
}

Assistant:

IfcSlab() : Object("IfcSlab") {}